

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

void __thiscall
spvtools::opt::CopyPropagateArrays::UpdateUses
          (CopyPropagateArrays *this,Instruction *original_ptr_inst,Instruction *new_ptr_inst)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  initializer_list<unsigned_int> init_list_03;
  initializer_list<unsigned_int> init_list_04;
  initializer_list<unsigned_int> init_list_05;
  initializer_list<unsigned_int> init_list_06;
  initializer_list<unsigned_int> init_list_07;
  initializer_list<unsigned_int> init_list_08;
  initializer_list<unsigned_int> init_list_09;
  uint uVar1;
  Instruction *pIVar2;
  pointer ppVar3;
  bool bVar4;
  CommonDebugInfoInstructions CVar5;
  uint32_t uVar6;
  Op OVar7;
  uint32_t uVar8;
  IRContext *pIVar9;
  TypeManager *this_00;
  ConstantManager *this_01;
  reference ppVar10;
  DebugInfoManager *this_02;
  DefUseManager *this_03;
  uint32_t local_40c;
  iterator local_408;
  undefined8 local_400;
  SmallVector<unsigned_int,_2UL> local_3f8;
  uint32_t local_3cc;
  iterator local_3c8;
  undefined8 local_3c0;
  SmallVector<unsigned_int,_2UL> local_3b8;
  uint32_t local_390;
  uint32_t local_38c;
  uint32_t copy;
  uint32_t pointee_type_id;
  Instruction *pointer_type;
  Instruction *target_pointer;
  undefined1 local_370 [4];
  uint32_t i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> access_chain_1;
  uint32_t new_type_id_1;
  SmallVector<unsigned_int,_2UL> local_340;
  uint32_t local_314;
  StorageClass local_310;
  uint32_t new_pointer_type_id;
  StorageClass storage_class;
  uint32_t new_pointee_type_id;
  Instruction *pointer_type_inst_1;
  Constant *local_2f8;
  Constant *index_const;
  undefined1 local_2e8 [4];
  uint32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> access_chain;
  SmallVector<unsigned_int,_2UL> local_2b8;
  uint32_t local_28c;
  iterator local_288;
  undefined8 local_280;
  SmallVector<unsigned_int,_2UL> local_278;
  uint32_t local_24c;
  Instruction *pIStack_248;
  uint32_t new_type_id;
  Instruction *pointer_type_inst;
  iterator local_238;
  undefined8 local_230;
  SmallVector<unsigned_int,_2UL> local_228;
  uint32_t local_1fc;
  iterator local_1f8;
  undefined8 local_1f0;
  SmallVector<unsigned_int,_2UL> local_1e8;
  uint32_t local_1bc;
  iterator local_1b8;
  undefined8 local_1b0;
  SmallVector<unsigned_int,_2UL> local_1a8;
  Instruction *local_180;
  Instruction *deref_expr_instr;
  Instruction *dbg_expr;
  iterator local_168;
  undefined8 local_160;
  SmallVector<unsigned_int,_2UL> local_158;
  uint local_12c;
  iterator local_128;
  undefined8 local_120;
  SmallVector<unsigned_int,_2UL> local_118;
  uint32_t local_ec;
  iterator local_e8;
  undefined8 local_e0;
  SmallVector<unsigned_int,_2UL> local_d8;
  uint32_t local_ac;
  Instruction *pIStack_a8;
  uint32_t index;
  Instruction *use;
  pair<spvtools::opt::Instruction_*,_unsigned_int> pair;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  *__range2;
  function<void_(spvtools::opt::Instruction_*,_unsigned_int)> local_70;
  undefined1 local_50 [8];
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  uses;
  DefUseManager *def_use_mgr;
  ConstantManager *const_mgr;
  TypeManager *type_mgr;
  Instruction *new_ptr_inst_local;
  Instruction *original_ptr_inst_local;
  CopyPropagateArrays *this_local;
  
  pIVar9 = Pass::context((Pass *)this);
  this_00 = IRContext::get_type_mgr(pIVar9);
  pIVar9 = Pass::context((Pass *)this);
  this_01 = IRContext::get_constant_mgr(pIVar9);
  pIVar9 = Pass::context((Pass *)this);
  uses.
  super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)IRContext::get_def_use_mgr(pIVar9);
  std::
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  ::vector((vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
            *)local_50);
  ppVar3 = uses.
           super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __range2 = (vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
              *)local_50;
  std::function<void(spvtools::opt::Instruction*,unsigned_int)>::
  function<spvtools::opt::CopyPropagateArrays::UpdateUses(spvtools::opt::Instruction*,spvtools::opt::Instruction*)::__0,void>
            ((function<void(spvtools::opt::Instruction*,unsigned_int)> *)&local_70,
             (anon_class_8_1_899298ca *)&__range2);
  analysis::DefUseManager::ForEachUse((DefUseManager *)ppVar3,original_ptr_inst,&local_70);
  std::function<void_(spvtools::opt::Instruction_*,_unsigned_int)>::~function(&local_70);
  __end2 = std::
           vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
           ::begin((vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                    *)local_50);
  pair._8_8_ = std::
               vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
               ::end((vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                      *)local_50);
  do {
    bVar4 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>_>
                                *)&pair.second);
    if (!bVar4) {
      std::
      vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
      ::~vector((vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                 *)local_50);
      return;
    }
    ppVar10 = __gnu_cxx::
              __normal_iterator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>_>
              ::operator*(&__end2);
    pIStack_a8 = ppVar10->first;
    pair.first = *(Instruction **)&ppVar10->second;
    local_ac = (uint32_t)pair.first;
    use = pIStack_a8;
    bVar4 = opt::Instruction::IsCommonDebugInstr(pIStack_a8);
    if (bVar4) {
      CVar5 = opt::Instruction::GetCommonDebugOpcode(pIStack_a8);
      if (CVar5 == CommonDebugInfoDebugDeclare) {
        OVar7 = opt::Instruction::opcode(new_ptr_inst);
        if ((OVar7 == OpVariable) ||
           (OVar7 = opt::Instruction::opcode(new_ptr_inst), OVar7 == OpFunctionParameter)) {
          pIVar9 = Pass::context((Pass *)this);
          IRContext::ForgetUses(pIVar9,pIStack_a8);
          pIVar2 = pIStack_a8;
          uVar6 = local_ac;
          local_ec = opt::Instruction::result_id(new_ptr_inst);
          local_e8 = &local_ec;
          local_e0 = 1;
          init_list_09._M_len = 1;
          init_list_09._M_array = local_e8;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_d8,init_list_09);
          opt::Instruction::SetOperand(pIVar2,uVar6,&local_d8);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_d8);
          pIVar9 = Pass::context((Pass *)this);
          IRContext::AnalyzeUses(pIVar9,pIStack_a8);
        }
        else {
          pIVar9 = Pass::context((Pass *)this);
          IRContext::ForgetUses(pIVar9,pIStack_a8);
          pIVar2 = pIStack_a8;
          uVar6 = local_ac - 2;
          local_12c = 0x1d;
          local_128 = &local_12c;
          local_120 = 1;
          init_list_08._M_len = 1;
          init_list_08._M_array = local_128;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_118,init_list_08);
          opt::Instruction::SetOperand(pIVar2,uVar6,&local_118);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_118);
          pIVar2 = pIStack_a8;
          uVar6 = local_ac;
          dbg_expr._4_4_ = opt::Instruction::result_id(new_ptr_inst);
          local_168 = (iterator)((long)&dbg_expr + 4);
          local_160 = 1;
          init_list_07._M_len = 1;
          init_list_07._M_array = local_168;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_158,init_list_07);
          opt::Instruction::SetOperand(pIVar2,uVar6,&local_158);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_158);
          ppVar3 = uses.
                   super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          uVar6 = opt::Instruction::GetSingleWordOperand(pIStack_a8,local_ac + 1);
          deref_expr_instr = analysis::DefUseManager::GetDef((DefUseManager *)ppVar3,uVar6);
          pIVar9 = Pass::context((Pass *)this);
          this_02 = IRContext::get_debug_info_mgr(pIVar9);
          local_180 = analysis::DebugInfoManager::DerefDebugExpression(this_02,deref_expr_instr);
          pIVar2 = pIStack_a8;
          uVar6 = local_ac + 1;
          local_1bc = opt::Instruction::result_id(local_180);
          local_1b8 = &local_1bc;
          local_1b0 = 1;
          init_list_06._M_len = 1;
          init_list_06._M_array = local_1b8;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1a8,init_list_06);
          opt::Instruction::SetOperand(pIVar2,uVar6,&local_1a8);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1a8);
          pIVar9 = Pass::context((Pass *)this);
          IRContext::AnalyzeUses(pIVar9,local_180);
          pIVar9 = Pass::context((Pass *)this);
          IRContext::AnalyzeUses(pIVar9,pIStack_a8);
        }
      }
      else {
        if (CVar5 != CommonDebugInfoDebugValue) {
          __assert_fail("false && \"Don\'t know how to rewrite instruction\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                        ,0x2b3,
                        "void spvtools::opt::CopyPropagateArrays::UpdateUses(Instruction *, Instruction *)"
                       );
        }
        pIVar9 = Pass::context((Pass *)this);
        IRContext::ForgetUses(pIVar9,pIStack_a8);
        pIVar2 = pIStack_a8;
        uVar6 = local_ac;
        local_1fc = opt::Instruction::result_id(new_ptr_inst);
        local_1f8 = &local_1fc;
        local_1f0 = 1;
        init_list_05._M_len = 1;
        init_list_05._M_array = local_1f8;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1e8,init_list_05);
        opt::Instruction::SetOperand(pIVar2,uVar6,&local_1e8);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1e8);
        pIVar9 = Pass::context((Pass *)this);
        IRContext::AnalyzeUses(pIVar9,pIStack_a8);
      }
    }
    else {
      OVar7 = opt::Instruction::opcode(pIStack_a8);
      ppVar3 = uses.
               super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      switch(OVar7) {
      case OpExtInst:
        bVar4 = IsInterpolationInstruction(this,pIStack_a8);
        if (!bVar4) {
          __assert_fail("false && \"Don\'t know how to rewrite instruction\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                        ,0x2d5,
                        "void spvtools::opt::CopyPropagateArrays::UpdateUses(Instruction *, Instruction *)"
                       );
        }
        pIVar9 = Pass::context((Pass *)this);
        IRContext::ForgetUses(pIVar9,pIStack_a8);
        pIVar2 = pIStack_a8;
        uVar6 = local_ac;
        local_28c = opt::Instruction::result_id(new_ptr_inst);
        local_288 = &local_28c;
        local_280 = 1;
        init_list_03._M_len = 1;
        init_list_03._M_array = local_288;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_278,init_list_03);
        opt::Instruction::SetOperand(pIVar2,uVar6,&local_278);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_278);
        pIVar9 = Pass::context((Pass *)this);
        IRContext::AnalyzeUses(pIVar9,pIStack_a8);
        break;
      default:
        __assert_fail("false && \"Don\'t know how to rewrite instruction\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                      ,0x33b,
                      "void spvtools::opt::CopyPropagateArrays::UpdateUses(Instruction *, Instruction *)"
                     );
      case OpImageTexelPointer:
      case OpDecorate:
        pIVar9 = Pass::context((Pass *)this);
        IRContext::ForgetUses(pIVar9,pIStack_a8);
        pIVar2 = pIStack_a8;
        uVar6 = local_ac;
        local_40c = opt::Instruction::result_id(new_ptr_inst);
        local_408 = &local_40c;
        local_400 = 1;
        init_list._M_len = 1;
        init_list._M_array = local_408;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_3f8,init_list);
        opt::Instruction::SetOperand(pIVar2,uVar6,&local_3f8);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_3f8);
        pIVar9 = Pass::context((Pass *)this);
        IRContext::AnalyzeUses(pIVar9,pIStack_a8);
        break;
      case OpLoad:
        pIVar9 = Pass::context((Pass *)this);
        IRContext::ForgetUses(pIVar9,pIStack_a8);
        pIVar2 = pIStack_a8;
        uVar6 = local_ac;
        pointer_type_inst._4_4_ = opt::Instruction::result_id(new_ptr_inst);
        local_238 = (iterator)((long)&pointer_type_inst + 4);
        local_230 = 1;
        init_list_04._M_len = 1;
        init_list_04._M_array = local_238;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_228,init_list_04);
        opt::Instruction::SetOperand(pIVar2,uVar6,&local_228);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_228);
        ppVar3 = uses.
                 super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        uVar6 = opt::Instruction::type_id(new_ptr_inst);
        pIStack_248 = analysis::DefUseManager::GetDef((DefUseManager *)ppVar3,uVar6);
        uVar6 = opt::Instruction::GetSingleWordInOperand(pIStack_248,1);
        local_24c = uVar6;
        uVar8 = opt::Instruction::type_id(pIStack_a8);
        if (uVar6 == uVar8) {
          pIVar9 = Pass::context((Pass *)this);
          IRContext::AnalyzeUses(pIVar9,pIStack_a8);
        }
        else {
          opt::Instruction::SetResultType(pIStack_a8,local_24c);
          pIVar9 = Pass::context((Pass *)this);
          IRContext::AnalyzeUses(pIVar9,pIStack_a8);
          UpdateUses(this,pIStack_a8,pIStack_a8);
        }
        AddUsesToWorklist(this,pIStack_a8);
        break;
      case OpStore:
        if (local_ac == 1) {
          uVar6 = opt::Instruction::GetSingleWordInOperand(pIStack_a8,0);
          pointer_type = analysis::DefUseManager::GetDef((DefUseManager *)ppVar3,uVar6);
          ppVar3 = uses.
                   super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          uVar6 = opt::Instruction::type_id(pointer_type);
          _copy = analysis::DefUseManager::GetDef((DefUseManager *)ppVar3,uVar6);
          local_38c = opt::Instruction::GetSingleWordInOperand(_copy,1);
          local_390 = Pass::GenerateCopy((Pass *)this,original_ptr_inst,local_38c,pIStack_a8);
          if (local_390 == 0) {
            __assert_fail("copy != 0 && \"Should not be updating uses unless we know it can be done.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                          ,0x329,
                          "void spvtools::opt::CopyPropagateArrays::UpdateUses(Instruction *, Instruction *)"
                         );
          }
          pIVar9 = Pass::context((Pass *)this);
          IRContext::ForgetUses(pIVar9,pIStack_a8);
          pIVar2 = pIStack_a8;
          uVar6 = local_ac;
          local_3cc = local_390;
          local_3c8 = &local_3cc;
          local_3c0 = 1;
          init_list_00._M_len = 1;
          init_list_00._M_array = local_3c8;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_3b8,init_list_00);
          opt::Instruction::SetInOperand(pIVar2,uVar6,&local_3b8);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_3b8);
          pIVar9 = Pass::context((Pass *)this);
          IRContext::AnalyzeUses(pIVar9,pIStack_a8);
        }
        break;
      case OpAccessChain:
        pIVar9 = Pass::context((Pass *)this);
        IRContext::ForgetUses(pIVar9,pIStack_a8);
        pIVar2 = pIStack_a8;
        uVar6 = local_ac;
        access_chain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = opt::Instruction::result_id(new_ptr_inst);
        init_list_02._M_len = 1;
        init_list_02._M_array =
             (iterator)
             ((long)&access_chain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_2b8,init_list_02);
        opt::Instruction::SetOperand(pIVar2,uVar6,&local_2b8);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_2b8);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8);
        for (index_const._4_4_ = 1; uVar1 = index_const._4_4_,
            uVar6 = opt::Instruction::NumInOperands(pIStack_a8), uVar1 < uVar6;
            index_const._4_4_ = index_const._4_4_ + 1) {
          uVar6 = opt::Instruction::GetSingleWordInOperand(pIStack_a8,index_const._4_4_);
          local_2f8 = analysis::ConstantManager::FindDeclaredConstant(this_01,uVar6);
          if (local_2f8 == (Constant *)0x0) {
            pointer_type_inst_1._0_4_ = 0;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8,
                       (value_type *)&pointer_type_inst_1);
          }
          else {
            pointer_type_inst_1._4_4_ = analysis::Constant::GetU32(local_2f8);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8,
                       (value_type *)((long)&pointer_type_inst_1 + 4));
          }
        }
        this_03 = Pass::get_def_use_mgr((Pass *)this);
        uVar6 = opt::Instruction::type_id(new_ptr_inst);
        _storage_class = analysis::DefUseManager::GetDef(this_03,uVar6);
        uVar6 = opt::Instruction::GetSingleWordInOperand(_storage_class,1);
        new_pointer_type_id =
             GetMemberTypeId(this,uVar6,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8);
        local_310 = opt::Instruction::GetSingleWordInOperand(_storage_class,0);
        uVar6 = analysis::TypeManager::FindPointerToType(this_00,new_pointer_type_id,local_310);
        local_314 = uVar6;
        uVar8 = opt::Instruction::type_id(pIStack_a8);
        if (uVar6 == uVar8) {
          pIVar9 = Pass::context((Pass *)this);
          IRContext::AnalyzeUses(pIVar9,pIStack_a8);
        }
        else {
          opt::Instruction::SetResultType(pIStack_a8,local_314);
          pIVar9 = Pass::context((Pass *)this);
          IRContext::AnalyzeUses(pIVar9,pIStack_a8);
          UpdateUses(this,pIStack_a8,pIStack_a8);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8);
        break;
      case OpCompositeExtract:
        pIVar9 = Pass::context((Pass *)this);
        IRContext::ForgetUses(pIVar9,pIStack_a8);
        pIVar2 = pIStack_a8;
        uVar6 = local_ac;
        access_chain_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = opt::Instruction::result_id(new_ptr_inst);
        init_list_01._M_len = 1;
        init_list_01._M_array =
             (iterator)
             ((long)&access_chain_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_340,init_list_01);
        opt::Instruction::SetOperand(pIVar2,uVar6,&local_340);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_340);
        access_chain_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = opt::Instruction::type_id(new_ptr_inst);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_370);
        for (target_pointer._4_4_ = 1; uVar1 = target_pointer._4_4_,
            uVar6 = opt::Instruction::NumInOperands(pIStack_a8), uVar1 < uVar6;
            target_pointer._4_4_ = target_pointer._4_4_ + 1) {
          target_pointer._0_4_ =
               opt::Instruction::GetSingleWordInOperand(pIStack_a8,target_pointer._4_4_);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_370,
                     (value_type *)&target_pointer);
        }
        uVar6 = GetMemberTypeId(this,(uint32_t)
                                     access_chain_1.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_370);
        access_chain_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = uVar6;
        uVar8 = opt::Instruction::type_id(pIStack_a8);
        if (uVar6 == uVar8) {
          pIVar9 = Pass::context((Pass *)this);
          IRContext::AnalyzeUses(pIVar9,pIStack_a8);
        }
        else {
          opt::Instruction::SetResultType
                    (pIStack_a8,
                     (uint32_t)
                     access_chain_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
          pIVar9 = Pass::context((Pass *)this);
          IRContext::AnalyzeUses(pIVar9,pIStack_a8);
          UpdateUses(this,pIStack_a8,pIStack_a8);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_370);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void CopyPropagateArrays::UpdateUses(Instruction* original_ptr_inst,
                                     Instruction* new_ptr_inst) {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();

  std::vector<std::pair<Instruction*, uint32_t> > uses;
  def_use_mgr->ForEachUse(original_ptr_inst,
                          [&uses](Instruction* use, uint32_t index) {
                            uses.push_back({use, index});
                          });

  for (auto pair : uses) {
    Instruction* use = pair.first;
    uint32_t index = pair.second;

    if (use->IsCommonDebugInstr()) {
      switch (use->GetCommonDebugOpcode()) {
        case CommonDebugInfoDebugDeclare: {
          if (new_ptr_inst->opcode() == spv::Op::OpVariable ||
              new_ptr_inst->opcode() == spv::Op::OpFunctionParameter) {
            context()->ForgetUses(use);
            use->SetOperand(index, {new_ptr_inst->result_id()});
            context()->AnalyzeUses(use);
          } else {
            // Based on the spec, we cannot use a pointer other than OpVariable
            // or OpFunctionParameter for DebugDeclare. We have to use
            // DebugValue with Deref.

            context()->ForgetUses(use);

            // Change DebugDeclare to DebugValue.
            use->SetOperand(index - 2,
                            {static_cast<uint32_t>(CommonDebugInfoDebugValue)});
            use->SetOperand(index, {new_ptr_inst->result_id()});

            // Add Deref operation.
            Instruction* dbg_expr =
                def_use_mgr->GetDef(use->GetSingleWordOperand(index + 1));
            auto* deref_expr_instr =
                context()->get_debug_info_mgr()->DerefDebugExpression(dbg_expr);
            use->SetOperand(index + 1, {deref_expr_instr->result_id()});

            context()->AnalyzeUses(deref_expr_instr);
            context()->AnalyzeUses(use);
          }
          break;
        }
        case CommonDebugInfoDebugValue:
          context()->ForgetUses(use);
          use->SetOperand(index, {new_ptr_inst->result_id()});
          context()->AnalyzeUses(use);
          break;
        default:
          assert(false && "Don't know how to rewrite instruction");
          break;
      }
      continue;
    }

    switch (use->opcode()) {
      case spv::Op::OpLoad: {
        // Replace the actual use.
        context()->ForgetUses(use);
        use->SetOperand(index, {new_ptr_inst->result_id()});

        // Update the type.
        Instruction* pointer_type_inst =
            def_use_mgr->GetDef(new_ptr_inst->type_id());
        uint32_t new_type_id =
            pointer_type_inst->GetSingleWordInOperand(kTypePointerPointeeInIdx);
        if (new_type_id != use->type_id()) {
          use->SetResultType(new_type_id);
          context()->AnalyzeUses(use);
          UpdateUses(use, use);
        } else {
          context()->AnalyzeUses(use);
        }

        AddUsesToWorklist(use);
      } break;
      case spv::Op::OpExtInst: {
        if (IsInterpolationInstruction(use)) {
          // Replace the actual use.
          context()->ForgetUses(use);
          use->SetOperand(index, {new_ptr_inst->result_id()});
          context()->AnalyzeUses(use);
        } else {
          assert(false && "Don't know how to rewrite instruction");
        }
      } break;
      case spv::Op::OpAccessChain: {
        // Update the actual use.
        context()->ForgetUses(use);
        use->SetOperand(index, {new_ptr_inst->result_id()});

        // Convert the ids on the OpAccessChain to indices that can be used to
        // get the specific member.
        std::vector<uint32_t> access_chain;
        for (uint32_t i = 1; i < use->NumInOperands(); ++i) {
          const analysis::Constant* index_const =
              const_mgr->FindDeclaredConstant(use->GetSingleWordInOperand(i));
          if (index_const) {
            access_chain.push_back(index_const->GetU32());
          } else {
            // Variable index means the type is an type where every element
            // is the same type.  Use element 0 to get the type.
            access_chain.push_back(0);
          }
        }

        Instruction* pointer_type_inst =
            get_def_use_mgr()->GetDef(new_ptr_inst->type_id());

        uint32_t new_pointee_type_id = GetMemberTypeId(
            pointer_type_inst->GetSingleWordInOperand(kTypePointerPointeeInIdx),
            access_chain);

        spv::StorageClass storage_class = static_cast<spv::StorageClass>(
            pointer_type_inst->GetSingleWordInOperand(
                kTypePointerStorageClassInIdx));

        uint32_t new_pointer_type_id =
            type_mgr->FindPointerToType(new_pointee_type_id, storage_class);

        if (new_pointer_type_id != use->type_id()) {
          use->SetResultType(new_pointer_type_id);
          context()->AnalyzeUses(use);
          UpdateUses(use, use);
        } else {
          context()->AnalyzeUses(use);
        }
      } break;
      case spv::Op::OpCompositeExtract: {
        // Update the actual use.
        context()->ForgetUses(use);
        use->SetOperand(index, {new_ptr_inst->result_id()});

        uint32_t new_type_id = new_ptr_inst->type_id();
        std::vector<uint32_t> access_chain;
        for (uint32_t i = 1; i < use->NumInOperands(); ++i) {
          access_chain.push_back(use->GetSingleWordInOperand(i));
        }

        new_type_id = GetMemberTypeId(new_type_id, access_chain);

        if (new_type_id != use->type_id()) {
          use->SetResultType(new_type_id);
          context()->AnalyzeUses(use);
          UpdateUses(use, use);
        } else {
          context()->AnalyzeUses(use);
        }
      } break;
      case spv::Op::OpStore:
        // If the use is the pointer, then it is the single store to that
        // variable.  We do not want to replace it.  Instead, it will become
        // dead after all of the loads are removed, and ADCE will get rid of it.
        //
        // If the use is the object being stored, we will create a copy of the
        // object turning it into the correct type. The copy is done by
        // decomposing the object into the base type, which must be the same,
        // and then rebuilding them.
        if (index == 1) {
          Instruction* target_pointer = def_use_mgr->GetDef(
              use->GetSingleWordInOperand(kStorePointerInOperand));
          Instruction* pointer_type =
              def_use_mgr->GetDef(target_pointer->type_id());
          uint32_t pointee_type_id =
              pointer_type->GetSingleWordInOperand(kTypePointerPointeeInIdx);
          uint32_t copy = GenerateCopy(original_ptr_inst, pointee_type_id, use);
          assert(copy != 0 &&
                 "Should not be updating uses unless we know it can be done.");

          context()->ForgetUses(use);
          use->SetInOperand(index, {copy});
          context()->AnalyzeUses(use);
        }
        break;
      case spv::Op::OpDecorate:
      // We treat an OpImageTexelPointer as a load.  The result type should
      // always have the Image storage class, and should not need to be
      // updated.
      case spv::Op::OpImageTexelPointer:
        // Replace the actual use.
        context()->ForgetUses(use);
        use->SetOperand(index, {new_ptr_inst->result_id()});
        context()->AnalyzeUses(use);
        break;
      default:
        assert(false && "Don't know how to rewrite instruction");
        break;
    }
  }
}